

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O1

string * __thiscall
OpenMD::DumpWriter::prepareSiteLine_abi_cxx11_
          (string *__return_storage_ptr__,DumpWriter *this,StuntDouble *sd,int ioIndex,int siteIndex
          )

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  SnapshotManager *pSVar5;
  long lVar6;
  size_t sVar7;
  undefined4 in_register_0000000c;
  long lVar8;
  undefined4 in_register_00000084;
  uint uVar9;
  string id;
  string line;
  string type;
  char tempBuffer [4096];
  undefined1 *local_10c8;
  undefined8 local_10c0;
  undefined1 local_10b8;
  undefined7 uStack_10b7;
  undefined1 *local_10a8;
  undefined8 local_10a0;
  undefined1 local_1098;
  undefined7 uStack_1097;
  undefined1 *local_1088;
  undefined8 local_1080;
  undefined1 local_1078;
  undefined7 uStack_1077;
  ulong local_1068;
  ulong local_1060;
  long *local_1058 [2];
  long local_1048 [2];
  char local_1038 [4104];
  
  pSVar5 = this->info_->sman_;
  uVar9 = pSVar5->atomStorageLayout_;
  uVar4 = pSVar5->rigidBodyStorageLayout_;
  local_10c8 = &local_10b8;
  local_10c0 = 0;
  local_10b8 = 0;
  local_1088 = &local_1078;
  local_1080 = 0;
  local_1078 = 0;
  local_10a8 = &local_1098;
  local_10a0 = 0;
  local_1098 = 0;
  if (sd->objType_ == otRigidBody) {
    snprintf(local_1038,0x1000,"%10d           ",CONCAT44(in_register_0000000c,ioIndex),
             CONCAT44(in_register_00000084,siteIndex));
    local_1058[0] = local_1048;
    sVar7 = strlen(local_1038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1058,local_1038,local_1038 + sVar7);
    std::__cxx11::string::operator=((string *)&local_10c8,(string *)local_1058);
    uVar9 = uVar4;
    if (local_1058[0] != local_1048) {
      operator_delete(local_1058[0],local_1048[0] + 1);
    }
  }
  else {
    snprintf(local_1038,0x1000,"%10d %10d",CONCAT44(in_register_0000000c,ioIndex),
             CONCAT44(in_register_00000084,siteIndex));
    local_1058[0] = local_1048;
    sVar7 = strlen(local_1038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1058,local_1038,local_1038 + sVar7);
    std::__cxx11::string::operator=((string *)&local_10c8,(string *)local_1058);
    if (local_1058[0] != local_1048) {
      operator_delete(local_1058[0],local_1048[0] + 1);
    }
  }
  if (this->needFlucQ_ == true) {
    if ((uVar9 >> 0xe & 1) != 0) {
      std::__cxx11::string::append((char *)&local_1088);
      uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).flucQPos.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + sd->storage_) +
                        (long)sd->localIndex_ * 8);
      if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
        snprintf(painCave.errMsg,2000,
                 "DumpWriter detected a numerical error writing the fluctuating charge for object %s"
                 ,local_10c8);
        painCave.isFatal = 1;
        simError();
      }
      snprintf(local_1038,0x1000," %13e ",uVar1);
      std::__cxx11::string::append((char *)&local_10a8);
    }
    if ((short)uVar9 < 0) {
      std::__cxx11::string::append((char *)&local_1088);
      uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).flucQVel.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + sd->storage_) +
                        (long)sd->localIndex_ * 8);
      if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
        snprintf(painCave.errMsg,2000,
                 "DumpWriter detected a numerical error writing the fluctuating charge velocity for object %s"
                 ,local_10c8);
        painCave.isFatal = 1;
        simError();
      }
      snprintf(local_1038,0x1000," %13e ",uVar1);
      std::__cxx11::string::append((char *)&local_10a8);
    }
    if (((uVar9 >> 0x10 & 1) != 0) && (this->needForceVector_ != false)) {
      std::__cxx11::string::append((char *)&local_1088);
      uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).flucQFrc.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + sd->storage_) +
                        (long)sd->localIndex_ * 8);
      if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
        snprintf(painCave.errMsg,2000,
                 "DumpWriter detected a numerical error writing the fluctuating charge force for object %s"
                 ,local_10c8);
        painCave.isFatal = 1;
        simError();
      }
      snprintf(local_1038,0x1000," %13e ",uVar1);
      std::__cxx11::string::append((char *)&local_10a8);
    }
  }
  if (((uVar9 >> 0xc & 1) != 0) && (this->needElectricField_ != false)) {
    std::__cxx11::string::append((char *)&local_1088);
    lVar8 = (long)sd->localIndex_;
    lVar6 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).electricField.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
    uVar1 = *(ulong *)(lVar6 + lVar8 * 0x18);
    uVar2 = *(ulong *)(lVar6 + 8 + lVar8 * 0x18);
    uVar3 = *(ulong *)(lVar6 + 0x10 + lVar8 * 0x18);
    if (0x7fefffffffffffff < (uVar3 & 0x7fffffffffffffff) ||
        (0x7fefffffffffffff < (uVar2 & 0x7fffffffffffffff) ||
        0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff))) {
      local_1068 = uVar3;
      local_1060 = uVar2;
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the electric field for object %s",
               local_10c8);
      painCave.isFatal = 1;
      simError();
      uVar2 = local_1060;
      uVar3 = local_1068;
    }
    snprintf(local_1038,0x1000," %13e %13e %13e",uVar1,uVar2,uVar3);
    std::__cxx11::string::append((char *)&local_10a8);
  }
  if (((uVar9 >> 0x11 & 1) != 0) && (this->needSitePotential_ != false)) {
    std::__cxx11::string::append((char *)&local_1088);
    uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).sitePotential
                                        .super__Vector_base<double,_std::allocator<double>_>._M_impl
                                        .super__Vector_impl_data._M_start + sd->storage_) +
                      (long)sd->localIndex_ * 8);
    if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the site potential for object %s",
               local_10c8);
      painCave.isFatal = 1;
      simError();
    }
    snprintf(local_1038,0x1000," %13e ",uVar1);
    std::__cxx11::string::append((char *)&local_10a8);
  }
  if (((uVar9 & 0x40) != 0) && (this->needParticlePot_ != false)) {
    std::__cxx11::string::append((char *)&local_1088);
    uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).particlePot.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + sd->storage_) +
                      (long)sd->localIndex_ * 8);
    if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the particle  potential for object %s"
               ,local_10c8);
      painCave.isFatal = 1;
      simError();
    }
    snprintf(local_1038,0x1000," %13e",uVar1);
    std::__cxx11::string::append((char *)&local_10a8);
  }
  if (((char)uVar9 < '\0') && (this->needDensity_ != false)) {
    std::__cxx11::string::append((char *)&local_1088);
    uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).density.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + sd->storage_) +
                      (long)sd->localIndex_ * 8);
    if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the density  for object %s",local_10c8
              );
      painCave.isFatal = 1;
      simError();
    }
    snprintf(local_1038,0x1000," %13e",uVar1);
    std::__cxx11::string::append((char *)&local_10a8);
  }
  snprintf(local_1038,0x1000,"%s %7s %s\n",local_10c8,local_1088,local_10a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar7 = strlen(local_1038);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_1038,local_1038 + sVar7);
  if (local_10a8 != &local_1098) {
    operator_delete(local_10a8,CONCAT71(uStack_1097,local_1098) + 1);
  }
  if (local_1088 != &local_1078) {
    operator_delete(local_1088,CONCAT71(uStack_1077,local_1078) + 1);
  }
  if (local_10c8 != &local_10b8) {
    operator_delete(local_10c8,CONCAT71(uStack_10b7,local_10b8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DumpWriter::prepareSiteLine(StuntDouble* sd, int ioIndex,
                                          int siteIndex) {
    int asl  = info_->getSnapshotManager()->getAtomStorageLayout();
    int rbsl = info_->getSnapshotManager()->getRigidBodyStorageLayout();
    int sl {};

    std::string id;
    std::string type;
    std::string line;
    char tempBuffer[4096];

    if (sd->isRigidBody()) {
      sl = rbsl;
      snprintf(tempBuffer, 4096, "%10d           ", ioIndex);
      id = std::string(tempBuffer);
    } else {
      sl = asl;
      snprintf(tempBuffer, 4096, "%10d %10d", ioIndex, siteIndex);
      id = std::string(tempBuffer);
    }

    if (needFlucQ_) {
      if (sl & DataStorage::dslFlucQPosition) {
        type += "c";
        RealType fqPos = sd->getFlucQPos();
        if (std::isinf(fqPos) || std::isnan(fqPos)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the"
                   " fluctuating charge for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e ", fqPos);
        line += tempBuffer;
      }

      if (sl & DataStorage::dslFlucQVelocity) {
        type += "w";
        RealType fqVel = sd->getFlucQVel();
        if (std::isinf(fqVel) || std::isnan(fqVel)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the"
                   " fluctuating charge velocity for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e ", fqVel);
        line += tempBuffer;
      }

      if (needForceVector_) {
        if (sl & DataStorage::dslFlucQForce) {
          type += "g";
          RealType fqFrc = sd->getFlucQFrc();
          if (std::isinf(fqFrc) || std::isnan(fqFrc)) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "DumpWriter detected a numerical error writing the"
                     " fluctuating charge force for object %s",
                     id.c_str());
            painCave.isFatal = 1;
            simError();
          }
          snprintf(tempBuffer, 4096, " %13e ", fqFrc);
          line += tempBuffer;
        }
      }
    }

    if (needElectricField_) {
      if (sl & DataStorage::dslElectricField) {
        type += "e";
        Vector3d eField = sd->getElectricField();
        if (std::isinf(eField[0]) || std::isnan(eField[0]) ||
            std::isinf(eField[1]) || std::isnan(eField[1]) ||
            std::isinf(eField[2]) || std::isnan(eField[2])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the electric"
                   " field for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e %13e %13e", eField[0], eField[1],
                 eField[2]);
        line += tempBuffer;
      }
    }

    if (needSitePotential_) {
      if (sl & DataStorage::dslSitePotential) {
        type += "s";
        RealType sPot = sd->getSitePotential();
        if (std::isinf(sPot) || std::isnan(sPot)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the"
                   " site potential for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e ", sPot);
        line += tempBuffer;
      }
    }

    if (needParticlePot_) {
      if (sl & DataStorage::dslParticlePot) {
        type += "u";
        RealType particlePot = sd->getParticlePot();
        if (std::isinf(particlePot) || std::isnan(particlePot)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the particle "
                   " potential for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e", particlePot);
        line += tempBuffer;
      }
    }

    if (needDensity_) {
      if (sl & DataStorage::dslDensity) {
        type += "d";
        RealType density = sd->getDensity();
        if (std::isinf(density) || std::isnan(density)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the density "
                   " for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e", density);
        line += tempBuffer;
      }
    }

    snprintf(tempBuffer, 4096, "%s %7s %s\n", id.c_str(), type.c_str(),
             line.c_str());
    return std::string(tempBuffer);
  }